

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

int main(void)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  TerminalInfo term_00;
  long y;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ostream *poVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long x;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  Size char_sz;
  Point to;
  TerminalInfo term;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_a98;
  BrailleCanvas canvas;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_940;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_858;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_770;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_688;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_5a0;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_4b8;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_3d0;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_2e8;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_200;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> local_118;
  
  term.mode = None;
  term.foreground_color.r = 0.9;
  term.foreground_color.g = 0.9;
  term.foreground_color.b = 0.9;
  term.foreground_color.a = 1.0;
  term.background_color.r = 0.0;
  term.background_color.g = 0.0;
  term.background_color.b = 0.0;
  term.background_color.a = 1.0;
  term.term_ = 1;
  plot::TerminalInfo::detect<void>(&term);
  term_00.term_ = term.term_;
  term_00.background_color.a = term.background_color.a;
  term_00.foreground_color.b = term.foreground_color.b;
  term_00.foreground_color.g = term.foreground_color.g;
  term_00.background_color.r = term.background_color.r;
  term_00.foreground_color.a = term.foreground_color.a;
  term_00.background_color.b = term.background_color.b;
  term_00.background_color.g = term.background_color.g;
  term_00.foreground_color.r = term.foreground_color.r;
  term_00.mode = term.mode;
  char_sz.y = 7;
  char_sz.x = 0x1e;
  plot::BrailleCanvas::BrailleCanvas(&canvas,char_sz,term_00);
  uVar2 = canvas.cols_ * 2 - 1;
  local_858.bottom_ = canvas.cols_ * 2;
  uVar17 = canvas.lines_ * 4 - 2;
  local_858.left_ = canvas.lines_ << 2;
  uVar21 = -uVar17;
  if (0 < (long)uVar17) {
    uVar21 = uVar17;
  }
  uVar18 = (long)uVar2 >> 0x3f & uVar2;
  uVar15 = 0;
  if (0 < (long)uVar2) {
    uVar15 = uVar2;
  }
  uVar19 = (long)uVar17 >> 0x3f & uVar17;
  uVar13 = 0;
  if (0 < (long)uVar17) {
    uVar13 = uVar17;
  }
  local_858.top_ = 0;
  local_858.right_ = 0;
  local_a98.top_ = uVar18;
  local_a98.right_ = uVar19;
  local_a98.bottom_ = uVar15 + 1;
  local_a98.left_ = uVar13 + 1;
  plot::GenericRect<long>::clamp
            ((GenericRect<long> *)&local_940,(GenericRect<long> *)&local_a98,
             (GenericRect<long> *)&local_858);
  uVar21 = uVar21 >> 1;
  uVar17 = -uVar2;
  if (0 < (long)uVar2) {
    uVar17 = uVar2;
  }
  local_a98.bottom_ = local_940.bottom_;
  local_a98.left_ = local_940.left_;
  local_a98.top_ = local_940.top_;
  local_a98.right_ = local_940.right_;
  sVar4 = (long)local_940.top_ / 2;
  sVar5 = (long)local_940.right_ / 4;
  lVar11 = (long)local_940.bottom_ % 2 + (long)local_940.bottom_ / 2;
  if (lVar11 < 2) {
    lVar11 = 1;
  }
  lVar6 = ((long)local_940.left_ / 4 + 1) - (ulong)((local_940.left_ & 3) == 0);
  if (lVar6 < 2) {
    lVar6 = 1;
  }
  fVar24 = (float)uVar21;
  fVar25 = (float)(long)(uVar17 + 1);
  for (; (long)sVar5 < lVar6; sVar5 = sVar5 + 1) {
    uVar17 = sVar5 * 4;
    if (uVar17 - local_a98.right_ == 0 || (long)uVar17 < (long)local_a98.right_) {
      uVar17 = local_a98.right_;
    }
    if ((long)local_a98.left_ <= (long)uVar17) {
      uVar17 = local_a98.left_;
    }
    uVar14 = sVar5 * 4 + 4;
    sVar16 = local_a98.right_;
    if ((long)local_a98.right_ < (long)uVar14) {
      sVar16 = uVar14;
    }
    sVar23 = sVar4;
    if ((long)local_a98.left_ <= (long)sVar16) {
      sVar16 = local_a98.left_;
    }
    for (; (long)sVar23 < lVar11; sVar23 = sVar23 + 1) {
      uVar14 = sVar23 * 2;
      if ((long)(sVar23 * 2) <= (long)local_a98.top_) {
        uVar14 = local_a98.top_;
      }
      if ((long)local_a98.bottom_ <= (long)uVar14) {
        uVar14 = local_a98.bottom_;
      }
      uVar22 = sVar23 * 2 + 2;
      uVar12 = local_a98.top_;
      if ((long)local_a98.top_ < (long)uVar22) {
        uVar12 = uVar22;
      }
      if ((long)local_a98.bottom_ <= (long)uVar12) {
        uVar12 = local_a98.bottom_;
      }
      local_940.top_ = 0x3e4ccccd3e4ccccd;
      local_940.right_ = 0x3f8000003f800000;
      local_940.bottom_ = local_940.bottom_ & 0xffffffffffffff00;
      for (; (long)uVar14 < (long)uVar12; uVar14 = uVar14 + 1) {
        fVar26 = sinf(((float)(long)uVar14 * 12.566368) / fVar25);
        lVar7 = lroundf(fVar26 * fVar24);
        uVar22 = uVar21 - lVar7;
        fVar26 = sinf((((float)(long)uVar14 + 1.0) * 12.566368) / fVar25);
        lVar8 = lroundf(fVar26 * fVar24);
        uVar20 = uVar21 - lVar8;
        if (lVar8 == lVar7) {
          uVar20 = uVar22 + 1;
        }
        uVar1 = uVar20 + 1;
        if ((long)uVar20 < (long)uVar22) {
          uVar20 = uVar22 + 1;
          uVar22 = uVar1;
        }
        if ((long)uVar22 <= (long)uVar17) {
          uVar22 = uVar17;
        }
        if ((long)sVar16 <= (long)uVar20) {
          uVar20 = sVar16;
        }
        bVar10 = (byte)local_940.bottom_;
        for (; (long)uVar22 < (long)uVar20; uVar22 = uVar22 + 1) {
          bVar10 = bVar10 | *(byte *)((long)&plot::detail::braille::pixel_codes +
                                     (ulong)((uint)uVar22 & 3) + (ulong)((uint)uVar14 & 1) * 4);
          local_940.bottom_ = CONCAT71(local_940.bottom_._1_7_,bVar10);
        }
      }
      plot::BrailleCanvas::paint(&canvas,sVar5,sVar23,(block_t *)&local_940,Over);
    }
  }
  local_858.bottom_ = canvas.cols_ * 2;
  local_858.left_ = canvas.lines_ << 2;
  local_858.top_ = 0;
  local_858.right_ = 0;
  local_a98.top_ = uVar18;
  local_a98.right_ = uVar19;
  local_a98.bottom_ = uVar15 + 1;
  local_a98.left_ = uVar13 + 1;
  plot::GenericRect<long>::clamp
            ((GenericRect<long> *)&local_940,(GenericRect<long> *)&local_a98,
             (GenericRect<long> *)&local_858);
  local_a98.bottom_ = local_940.bottom_;
  local_a98.left_ = local_940.left_;
  local_a98.top_ = local_940.top_;
  local_a98.right_ = local_940.right_;
  sVar4 = (long)local_940.top_ / 2;
  sVar5 = (long)local_940.right_ / 4;
  lVar11 = (long)local_940.bottom_ % 2 + (long)local_940.bottom_ / 2;
  if (lVar11 < 2) {
    lVar11 = 1;
  }
  lVar6 = ((long)local_940.left_ / 4 + 1) - (ulong)((local_940.left_ & 3) == 0);
  if (lVar6 < 2) {
    lVar6 = 1;
  }
  for (; sVar16 = 2, (long)sVar5 < lVar6; sVar5 = sVar5 + 1) {
    uVar17 = sVar5 * 4;
    if (uVar17 - local_a98.right_ == 0 || (long)uVar17 < (long)local_a98.right_) {
      uVar17 = local_a98.right_;
    }
    if ((long)local_a98.left_ <= (long)uVar17) {
      uVar17 = local_a98.left_;
    }
    uVar15 = sVar5 * 4 + 4;
    sVar16 = local_a98.right_;
    if ((long)local_a98.right_ < (long)uVar15) {
      sVar16 = uVar15;
    }
    sVar23 = sVar4;
    if ((long)local_a98.left_ <= (long)sVar16) {
      sVar16 = local_a98.left_;
    }
    for (; (long)sVar23 < lVar11; sVar23 = sVar23 + 1) {
      uVar15 = sVar23 * 2;
      if ((long)(sVar23 * 2) <= (long)local_a98.top_) {
        uVar15 = local_a98.top_;
      }
      if ((long)local_a98.bottom_ <= (long)uVar15) {
        uVar15 = local_a98.bottom_;
      }
      uVar18 = sVar23 * 2 + 2;
      uVar13 = local_a98.top_;
      if ((long)local_a98.top_ < (long)uVar18) {
        uVar13 = uVar18;
      }
      if ((long)local_a98.bottom_ <= (long)uVar13) {
        uVar13 = local_a98.bottom_;
      }
      local_940.top_ = 0x3ecccccd3f800000;
      local_940.right_ = 0x3f8000003ecccccd;
      local_940.bottom_ = local_940.bottom_ & 0xffffffffffffff00;
      for (; (long)uVar15 < (long)uVar13; uVar15 = uVar15 + 1) {
        fVar26 = cosf(((float)(long)uVar15 * 12.566368) / fVar25);
        lVar7 = lroundf(fVar26 * fVar24);
        uVar18 = uVar21 - lVar7;
        fVar26 = cosf((((float)(long)uVar15 + 1.0) * 12.566368) / fVar25);
        lVar8 = lroundf(fVar26 * fVar24);
        uVar19 = uVar21 - lVar8;
        if (lVar8 == lVar7) {
          uVar19 = uVar18 + 1;
        }
        uVar14 = uVar19 + 1;
        if ((long)uVar19 < (long)uVar18) {
          uVar19 = uVar18 + 1;
          uVar18 = uVar14;
        }
        if ((long)uVar18 <= (long)uVar17) {
          uVar18 = uVar17;
        }
        if ((long)sVar16 <= (long)uVar19) {
          uVar19 = sVar16;
        }
        bVar10 = (byte)local_940.bottom_;
        for (; (long)uVar18 < (long)uVar19; uVar18 = uVar18 + 1) {
          bVar10 = bVar10 | *(byte *)((long)&plot::detail::braille::pixel_codes +
                                     (ulong)((uint)uVar18 & 3) + (ulong)((uint)uVar15 & 1) * 4);
          local_940.bottom_ = CONCAT71(local_940.bottom_._1_7_,bVar10);
        }
      }
      plot::BrailleCanvas::paint(&canvas,sVar5,sVar23,(block_t *)&local_940,Over);
    }
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar21;
  to.y = uVar21;
  to.x = uVar2;
  plot::BrailleCanvas::line(&canvas,&term.foreground_color,(Point)(auVar3 << 0x40),to,ClipSrc);
  local_940.block_.term_.term_ = term.term_;
  local_940.block_.term_.background_color.a = term.background_color.a;
  local_940.block_.term_.foreground_color.r = term.foreground_color.r;
  local_940.block_.term_.mode = term.mode;
  local_940.block_.term_.foreground_color.b = term.foreground_color.b;
  local_940.block_.term_.foreground_color.g = term.foreground_color.g;
  local_940.block_.term_.background_color.r = term.background_color.r;
  local_940.block_.term_.foreground_color.a = term.foreground_color.a;
  local_940.block_.term_.background_color.b = term.background_color.b;
  local_940.block_.term_.background_color.g = term.background_color.g;
  local_940.block_.label_._M_len = 0;
  local_940.block_.label_._M_str = (char *)0x0;
  local_940.block_.align_ = Left;
  local_940.block_.border_.top_left._M_len = 1;
  local_940.block_.border_.top_left._M_str = " ";
  local_940.block_.border_.top._M_len = 1;
  local_940.block_.border_.top._M_str = " ";
  local_940.block_.border_.top_right._M_len = 1;
  local_940.block_.border_.top_right._M_str = " ";
  local_940.block_.border_.left._M_len = 1;
  local_940.block_.border_.left._M_str = " ";
  local_940.block_.border_.right._M_len = 1;
  local_940.block_.border_.right._M_str = " ";
  local_940.block_.border_.bottom_left._M_len = 1;
  local_940.block_.border_.bottom_left._M_str = " ";
  local_940.block_.border_.bottom._M_len = 1;
  local_940.block_.border_.bottom._M_str = " ";
  local_940.block_.border_.bottom_right._M_len = 1;
  local_940.block_.border_.bottom_right._M_str = " ";
  local_940.top_ = 1;
  local_940.bottom_ = 0;
  local_940.right_ = sVar16;
  local_940.left_ = sVar16;
  local_940.block_.block_ = &canvas;
  poVar9 = plot::operator<<((ostream *)&std::cout,&local_940);
  local_858.block_.term_.term_ = term.term_;
  local_858.block_.term_.background_color.a = term.background_color.a;
  local_858.block_.term_.foreground_color.r = term.foreground_color.r;
  local_858.block_.term_.mode = term.mode;
  local_858.block_.term_.foreground_color.b = term.foreground_color.b;
  local_858.block_.term_.foreground_color.g = term.foreground_color.g;
  local_858.block_.term_.background_color.r = term.background_color.r;
  local_858.block_.term_.foreground_color.a = term.foreground_color.a;
  local_858.block_.term_.background_color.b = term.background_color.b;
  local_858.block_.term_.background_color.g = term.background_color.g;
  local_858.block_.label_._M_len = 5;
  local_858.block_.label_._M_str = "Label";
  local_858.block_.align_ = Left;
  local_858.block_.border_.top_left._M_len = 3;
  local_858.block_.border_.top_left._M_str = anon_var_dwarf_87b0;
  local_858.block_.border_.top._M_len = 3;
  local_858.block_.border_.top._M_str = anon_var_dwarf_868e;
  local_858.block_.border_.top_right._M_len = 3;
  local_858.block_.border_.top_right._M_str = anon_var_dwarf_87c8;
  local_858.block_.border_.left._M_len = 3;
  local_858.block_.border_.left._M_str = anon_var_dwarf_86a8;
  local_858.block_.border_.right._M_len = 3;
  local_858.block_.border_.right._M_str = anon_var_dwarf_86a8;
  local_858.block_.border_.bottom_left._M_len = 3;
  local_858.block_.border_.bottom_left._M_str = anon_var_dwarf_87e0;
  local_858.block_.border_.bottom._M_len = 3;
  local_858.block_.border_.bottom._M_str = anon_var_dwarf_868e;
  local_858.block_.border_.bottom_right._M_len = 3;
  local_858.block_.border_.bottom_right._M_str = anon_var_dwarf_87f8;
  local_858.top_ = 1;
  local_858.bottom_ = 0;
  local_858.right_ = sVar16;
  local_858.left_ = sVar16;
  local_858.block_.block_ = &canvas;
  poVar9 = plot::operator<<(poVar9,&local_858);
  local_a98.block_.term_.term_ = term.term_;
  local_a98.block_.term_.background_color.a = term.background_color.a;
  local_a98.block_.term_.foreground_color.r = term.foreground_color.r;
  local_a98.block_.term_.mode = term.mode;
  local_a98.block_.term_.foreground_color.b = term.foreground_color.b;
  local_a98.block_.term_.foreground_color.g = term.foreground_color.g;
  local_a98.block_.term_.background_color.r = term.background_color.r;
  local_a98.block_.term_.foreground_color.a = term.foreground_color.a;
  local_a98.block_.term_.background_color.b = term.background_color.b;
  local_a98.block_.term_.background_color.g = term.background_color.g;
  local_a98.block_.label_._M_len = 5;
  local_a98.block_.label_._M_str = "Label";
  local_a98.block_.align_ = Center;
  local_a98.block_.border_.top_left._M_len = 3;
  local_a98.block_.border_.top_left._M_str = anon_var_dwarf_87a4;
  local_a98.block_.border_.top._M_len = 3;
  local_a98.block_.border_.top._M_str = anon_var_dwarf_868e;
  local_a98.block_.border_.top_right._M_len = 3;
  local_a98.block_.border_.top_right._M_str = anon_var_dwarf_87bc;
  local_a98.block_.border_.left._M_len = 3;
  local_a98.block_.border_.left._M_str = anon_var_dwarf_86a8;
  local_a98.block_.border_.right._M_len = 3;
  local_a98.block_.border_.right._M_str = anon_var_dwarf_86a8;
  local_a98.block_.border_.bottom_left._M_len = 3;
  local_a98.block_.border_.bottom_left._M_str = anon_var_dwarf_87d4;
  local_a98.block_.border_.bottom._M_len = 3;
  local_a98.block_.border_.bottom._M_str = anon_var_dwarf_868e;
  local_a98.block_.border_.bottom_right._M_len = 3;
  local_a98.block_.border_.bottom_right._M_str = anon_var_dwarf_87ec;
  local_a98.top_ = 1;
  local_a98.bottom_ = 0;
  local_a98.right_ = sVar16;
  local_a98.left_ = sVar16;
  local_a98.block_.block_ = &canvas;
  poVar9 = plot::operator<<(poVar9,&local_a98);
  local_118.block_.term_.term_ = term.term_;
  local_118.block_.term_.background_color.a = term.background_color.a;
  local_118.block_.term_.foreground_color.r = term.foreground_color.r;
  local_118.block_.term_.mode = term.mode;
  local_118.block_.term_.foreground_color.b = term.foreground_color.b;
  local_118.block_.term_.foreground_color.g = term.foreground_color.g;
  local_118.block_.term_.background_color.r = term.background_color.r;
  local_118.block_.term_.foreground_color.a = term.foreground_color.a;
  local_118.block_.term_.background_color.b = term.background_color.b;
  local_118.block_.term_.background_color.g = term.background_color.g;
  local_118.block_.label_._M_len = 5;
  local_118.block_.label_._M_str = "Label";
  local_118.block_.align_ = Right;
  local_118.block_.border_.top_left._M_len = 3;
  local_118.block_.border_.top_left._M_str = anon_var_dwarf_8804;
  local_118.block_.border_.top._M_len = 3;
  local_118.block_.border_.top._M_str = anon_var_dwarf_86b4;
  local_118.block_.border_.top_right._M_len = 3;
  local_118.block_.border_.top_right._M_str = anon_var_dwarf_8810;
  local_118.block_.border_.left._M_len = 3;
  local_118.block_.border_.left._M_str = anon_var_dwarf_86c0;
  local_118.block_.border_.right._M_len = 3;
  local_118.block_.border_.right._M_str = anon_var_dwarf_86c0;
  local_118.block_.border_.bottom_left._M_len = 3;
  local_118.block_.border_.bottom_left._M_str = anon_var_dwarf_881c;
  local_118.block_.border_.bottom._M_len = 3;
  local_118.block_.border_.bottom._M_str = anon_var_dwarf_86b4;
  local_118.block_.border_.bottom_right._M_len = 3;
  local_118.block_.border_.bottom_right._M_str = anon_var_dwarf_8828;
  local_118.top_ = 1;
  local_118.bottom_ = 0;
  local_118.right_ = sVar16;
  local_118.left_ = sVar16;
  local_118.block_.block_ = &canvas;
  poVar9 = plot::operator<<(poVar9,&local_118);
  local_200.block_.term_.term_ = term.term_;
  local_200.block_.term_.background_color.a = term.background_color.a;
  local_200.block_.term_.foreground_color.r = term.foreground_color.r;
  local_200.block_.term_.mode = term.mode;
  local_200.block_.term_.foreground_color.b = term.foreground_color.b;
  local_200.block_.term_.foreground_color.g = term.foreground_color.g;
  local_200.block_.term_.background_color.r = term.background_color.r;
  local_200.block_.term_.foreground_color.a = term.foreground_color.a;
  local_200.block_.term_.background_color.b = term.background_color.b;
  local_200.block_.term_.background_color.g = term.background_color.g;
  local_200.block_.align_ = Left;
  local_200.block_.label_._M_len = 0;
  local_200.block_.label_._M_str = (char *)0x0;
  local_200.block_.border_.top_left._M_len = 3;
  local_200.block_.border_.top_left._M_str = anon_var_dwarf_87b0;
  local_200.block_.border_.top._M_len = 3;
  local_200.block_.border_.top._M_str = anon_var_dwarf_86cc;
  local_200.block_.border_.top_right._M_len = 3;
  local_200.block_.border_.top_right._M_str = anon_var_dwarf_87c8;
  local_200.block_.border_.left._M_len = 3;
  local_200.block_.border_.left._M_str = anon_var_dwarf_86e4;
  local_200.block_.border_.right._M_len = 3;
  local_200.block_.border_.right._M_str = anon_var_dwarf_86f0;
  local_200.block_.border_.bottom_left._M_len = 3;
  local_200.block_.border_.bottom_left._M_str = anon_var_dwarf_87e0;
  local_200.block_.border_.bottom._M_len = 3;
  local_200.block_.border_.bottom._M_str = anon_var_dwarf_86d8;
  local_200.block_.border_.bottom_right._M_len = 3;
  local_200.block_.border_.bottom_right._M_str = anon_var_dwarf_87f8;
  local_200.block_.block_ = &canvas;
  local_200.top_ = 1;
  local_200.bottom_ = 0;
  local_200.right_ = sVar16;
  local_200.left_ = sVar16;
  poVar9 = plot::operator<<(poVar9,&local_200);
  local_2e8.block_.term_.term_ = term.term_;
  local_2e8.block_.term_.background_color.a = term.background_color.a;
  local_2e8.block_.term_.foreground_color.r = term.foreground_color.r;
  local_2e8.block_.term_.mode = term.mode;
  local_2e8.block_.term_.foreground_color.b = term.foreground_color.b;
  local_2e8.block_.term_.foreground_color.g = term.foreground_color.g;
  local_2e8.block_.term_.background_color.r = term.background_color.r;
  local_2e8.block_.term_.foreground_color.a = term.foreground_color.a;
  local_2e8.block_.term_.background_color.b = term.background_color.b;
  local_2e8.block_.term_.background_color.g = term.background_color.g;
  local_2e8.block_.align_ = Left;
  local_2e8.block_.label_._M_len = 0;
  local_2e8.block_.label_._M_str = (char *)0x0;
  local_2e8.block_.border_.top_left._M_len = 3;
  local_2e8.block_.border_.top_left._M_str = anon_var_dwarf_87a4;
  local_2e8.block_.border_.top._M_len = 3;
  local_2e8.block_.border_.top._M_str = anon_var_dwarf_86cc;
  local_2e8.block_.border_.top_right._M_len = 3;
  local_2e8.block_.border_.top_right._M_str = anon_var_dwarf_87bc;
  local_2e8.block_.border_.left._M_len = 3;
  local_2e8.block_.border_.left._M_str = anon_var_dwarf_86e4;
  local_2e8.block_.border_.right._M_len = 3;
  local_2e8.block_.border_.right._M_str = anon_var_dwarf_86f0;
  local_2e8.block_.border_.bottom_left._M_len = 3;
  local_2e8.block_.border_.bottom_left._M_str = anon_var_dwarf_87d4;
  local_2e8.block_.border_.bottom._M_len = 3;
  local_2e8.block_.border_.bottom._M_str = anon_var_dwarf_86d8;
  local_2e8.block_.border_.bottom_right._M_len = 3;
  local_2e8.block_.border_.bottom_right._M_str = anon_var_dwarf_87ec;
  local_2e8.top_ = 1;
  local_2e8.bottom_ = 0;
  local_2e8.right_ = sVar16;
  local_2e8.left_ = sVar16;
  local_2e8.block_.block_ = &canvas;
  poVar9 = plot::operator<<(poVar9,&local_2e8);
  local_3d0.block_.term_.term_ = term.term_;
  local_3d0.block_.term_.background_color.a = term.background_color.a;
  local_3d0.block_.term_.foreground_color.r = term.foreground_color.r;
  local_3d0.block_.term_.mode = term.mode;
  local_3d0.block_.term_.foreground_color.b = term.foreground_color.b;
  local_3d0.block_.term_.foreground_color.g = term.foreground_color.g;
  local_3d0.block_.term_.background_color.r = term.background_color.r;
  local_3d0.block_.term_.foreground_color.a = term.foreground_color.a;
  local_3d0.block_.term_.background_color.b = term.background_color.b;
  local_3d0.block_.term_.background_color.g = term.background_color.g;
  local_3d0.block_.align_ = Left;
  local_3d0.block_.label_._M_len = 0;
  local_3d0.block_.label_._M_str = (char *)0x0;
  local_3d0.block_.border_.top_left._M_len = 3;
  local_3d0.block_.border_.top_left._M_str = anon_var_dwarf_8804;
  local_3d0.block_.border_.top._M_len = 3;
  local_3d0.block_.border_.top._M_str = anon_var_dwarf_86fc;
  local_3d0.block_.border_.top_right._M_len = 3;
  local_3d0.block_.border_.top_right._M_str = anon_var_dwarf_8810;
  local_3d0.block_.border_.left._M_len = 3;
  local_3d0.block_.border_.left._M_str = anon_var_dwarf_8714;
  local_3d0.block_.border_.right._M_len = 3;
  local_3d0.block_.border_.right._M_str = anon_var_dwarf_8720;
  local_3d0.block_.border_.bottom_left._M_len = 3;
  local_3d0.block_.border_.bottom_left._M_str = anon_var_dwarf_881c;
  local_3d0.block_.border_.bottom._M_len = 3;
  local_3d0.block_.border_.bottom._M_str = anon_var_dwarf_8708;
  local_3d0.block_.border_.bottom_right._M_len = 3;
  local_3d0.block_.border_.bottom_right._M_str = anon_var_dwarf_8828;
  local_3d0.top_ = 1;
  local_3d0.bottom_ = 0;
  local_3d0.right_ = sVar16;
  local_3d0.left_ = sVar16;
  local_3d0.block_.block_ = &canvas;
  poVar9 = plot::operator<<(poVar9,&local_3d0);
  local_4b8.block_.term_.term_ = term.term_;
  local_4b8.block_.term_.background_color.a = term.background_color.a;
  local_4b8.block_.term_.foreground_color.r = term.foreground_color.r;
  local_4b8.block_.term_.mode = term.mode;
  local_4b8.block_.term_.foreground_color.b = term.foreground_color.b;
  local_4b8.block_.term_.foreground_color.g = term.foreground_color.g;
  local_4b8.block_.term_.background_color.r = term.background_color.r;
  local_4b8.block_.term_.foreground_color.a = term.foreground_color.a;
  local_4b8.block_.term_.background_color.b = term.background_color.b;
  local_4b8.block_.term_.background_color.g = term.background_color.g;
  local_4b8.block_.label_._M_len = 0;
  local_4b8.block_.label_._M_str = (char *)0x0;
  local_4b8.block_.align_ = Left;
  local_4b8.block_.border_.top_left._M_len = 3;
  local_4b8.block_.border_.top_left._M_str = anon_var_dwarf_87b0;
  local_4b8.block_.border_.top._M_len = 3;
  local_4b8.block_.border_.top._M_str = anon_var_dwarf_872c;
  local_4b8.block_.border_.top_right._M_len = 3;
  local_4b8.block_.border_.top_right._M_str = anon_var_dwarf_87c8;
  local_4b8.block_.border_.left._M_len = 3;
  local_4b8.block_.border_.left._M_str = anon_var_dwarf_8738;
  local_4b8.block_.border_.right._M_len = 3;
  local_4b8.block_.border_.right._M_str = anon_var_dwarf_8738;
  local_4b8.block_.border_.bottom_left._M_len = 3;
  local_4b8.block_.border_.bottom_left._M_str = anon_var_dwarf_87e0;
  local_4b8.block_.border_.bottom._M_len = 3;
  local_4b8.block_.border_.bottom._M_str = anon_var_dwarf_872c;
  local_4b8.block_.border_.bottom_right._M_len = 3;
  local_4b8.block_.border_.bottom_right._M_str = anon_var_dwarf_87f8;
  local_4b8.top_ = 1;
  local_4b8.bottom_ = 0;
  local_4b8.right_ = sVar16;
  local_4b8.left_ = sVar16;
  local_4b8.block_.block_ = &canvas;
  poVar9 = plot::operator<<(poVar9,&local_4b8);
  local_5a0.block_.term_.term_ = term.term_;
  local_5a0.block_.term_.background_color.a = term.background_color.a;
  local_5a0.block_.term_.foreground_color.r = term.foreground_color.r;
  local_5a0.block_.term_.mode = term.mode;
  local_5a0.block_.term_.foreground_color.b = term.foreground_color.b;
  local_5a0.block_.term_.foreground_color.g = term.foreground_color.g;
  local_5a0.block_.term_.background_color.r = term.background_color.r;
  local_5a0.block_.term_.foreground_color.a = term.foreground_color.a;
  local_5a0.block_.term_.background_color.b = term.background_color.b;
  local_5a0.block_.term_.background_color.g = term.background_color.g;
  local_5a0.block_.align_ = Left;
  local_5a0.block_.label_._M_len = 0;
  local_5a0.block_.label_._M_str = (char *)0x0;
  local_5a0.block_.border_.top_left._M_len = 3;
  local_5a0.block_.border_.top_left._M_str = anon_var_dwarf_87a4;
  local_5a0.block_.border_.top._M_len = 3;
  local_5a0.block_.border_.top._M_str = anon_var_dwarf_872c;
  local_5a0.block_.border_.top_right._M_len = 3;
  local_5a0.block_.border_.top_right._M_str = anon_var_dwarf_87bc;
  local_5a0.block_.border_.left._M_len = 3;
  local_5a0.block_.border_.left._M_str = anon_var_dwarf_8738;
  local_5a0.block_.border_.right._M_len = 3;
  local_5a0.block_.border_.right._M_str = anon_var_dwarf_8738;
  local_5a0.block_.border_.bottom_left._M_len = 3;
  local_5a0.block_.border_.bottom_left._M_str = anon_var_dwarf_87d4;
  local_5a0.block_.border_.bottom._M_len = 3;
  local_5a0.block_.border_.bottom._M_str = anon_var_dwarf_872c;
  local_5a0.block_.border_.bottom_right._M_len = 3;
  local_5a0.block_.border_.bottom_right._M_str = anon_var_dwarf_87ec;
  local_5a0.top_ = 1;
  local_5a0.bottom_ = 0;
  local_5a0.right_ = sVar16;
  local_5a0.left_ = sVar16;
  local_5a0.block_.block_ = &canvas;
  poVar9 = plot::operator<<(poVar9,&local_5a0);
  local_688.block_.term_.term_ = term.term_;
  local_688.block_.term_.background_color.a = term.background_color.a;
  local_688.block_.term_.foreground_color.r = term.foreground_color.r;
  local_688.block_.term_.mode = term.mode;
  local_688.block_.term_.foreground_color.b = term.foreground_color.b;
  local_688.block_.term_.foreground_color.g = term.foreground_color.g;
  local_688.block_.term_.background_color.r = term.background_color.r;
  local_688.block_.term_.foreground_color.a = term.foreground_color.a;
  local_688.block_.term_.background_color.b = term.background_color.b;
  local_688.block_.term_.background_color.g = term.background_color.g;
  local_688.block_.label_._M_len = 0;
  local_688.block_.label_._M_str = (char *)0x0;
  local_688.block_.align_ = Left;
  local_688.block_.border_.top_left._M_len = 3;
  local_688.block_.border_.top_left._M_str = anon_var_dwarf_8804;
  local_688.block_.border_.top._M_len = 3;
  local_688.block_.border_.top._M_str = anon_var_dwarf_8744;
  local_688.block_.border_.top_right._M_len = 3;
  local_688.block_.border_.top_right._M_str = anon_var_dwarf_8810;
  local_688.block_.border_.left._M_len = 3;
  local_688.block_.border_.left._M_str = anon_var_dwarf_8750;
  local_688.block_.border_.right._M_len = 3;
  local_688.block_.border_.right._M_str = anon_var_dwarf_8750;
  local_688.block_.border_.bottom_left._M_len = 3;
  local_688.block_.border_.bottom_left._M_str = anon_var_dwarf_881c;
  local_688.block_.border_.bottom._M_len = 3;
  local_688.block_.border_.bottom._M_str = anon_var_dwarf_8744;
  local_688.block_.border_.bottom_right._M_len = 3;
  local_688.block_.border_.bottom_right._M_str = anon_var_dwarf_8828;
  local_688.top_ = 1;
  local_688.bottom_ = 0;
  local_688.right_ = sVar16;
  local_688.left_ = sVar16;
  local_688.block_.block_ = &canvas;
  poVar9 = plot::operator<<(poVar9,&local_688);
  local_770.block_.term_.term_ = term.term_;
  local_770.block_.term_.background_color.a = term.background_color.a;
  local_770.block_.term_.foreground_color.r = term.foreground_color.r;
  local_770.block_.term_.mode = term.mode;
  local_770.block_.term_.foreground_color.b = term.foreground_color.b;
  local_770.block_.term_.foreground_color.g = term.foreground_color.g;
  local_770.block_.term_.background_color.r = term.background_color.r;
  local_770.block_.term_.foreground_color.a = term.foreground_color.a;
  local_770.block_.term_.background_color.b = term.background_color.b;
  local_770.block_.term_.background_color.g = term.background_color.g;
  local_770.block_.align_ = Left;
  local_770.block_.label_._M_len = 0;
  local_770.block_.label_._M_str = (char *)0x0;
  local_770.block_.border_.top_left._M_len = 3;
  local_770.block_.border_.top_left._M_str = anon_var_dwarf_8774;
  local_770.block_.border_.top._M_len = 3;
  local_770.block_.border_.top._M_str = anon_var_dwarf_875c;
  local_770.block_.border_.top_right._M_len = 3;
  local_770.block_.border_.top_right._M_str = anon_var_dwarf_8780;
  local_770.block_.border_.left._M_len = 3;
  local_770.block_.border_.left._M_str = anon_var_dwarf_8768;
  local_770.block_.border_.right._M_len = 3;
  local_770.block_.border_.right._M_str = anon_var_dwarf_8768;
  local_770.block_.border_.bottom_left._M_len = 3;
  local_770.block_.border_.bottom_left._M_str = anon_var_dwarf_878c;
  local_770.block_.border_.bottom._M_len = 3;
  local_770.block_.border_.bottom._M_str = anon_var_dwarf_875c;
  local_770.block_.border_.bottom_right._M_len = 3;
  local_770.block_.border_.bottom_right._M_str = anon_var_dwarf_8798;
  local_770.top_ = 1;
  local_770.bottom_ = 1;
  local_770.right_ = sVar16;
  local_770.left_ = sVar16;
  local_770.block_.block_ = &canvas;
  plot::operator<<(poVar9,&local_770);
  std::ostream::flush();
  plot::BrailleCanvas::~BrailleCanvas(&canvas);
  return 0;
}

Assistant:

int main() {
    TerminalInfo term;
    term.detect();

    BrailleCanvas canvas({ 30, 7 }, term);

    Rect rect({ 0, 0 }, canvas.size() - Point(1, 2));
    auto size = rect.size() + Point(1, 1);

    auto y0 = rect.p1.y, A = size.y/2, N = size.x;
    float f = 2;

    canvas.stroke({ 0.2f, 0.2f, 1.0f }, rect, [y0,A,N,f](float x) {
              Coord base = y0 + A - std::lround(A*std::sin(2*3.141592f*f*x/N)),
                    end  = y0 + A - std::lround(A*std::sin(2*3.141592f*f*(x+1)/N));
              return (base != end) ? std::make_pair(base, end) : std::make_pair(base, base+1);
          })
          .stroke({ 1.0f, 0.4f, 0.4f }, rect, [y0,A,N,f](float x) {
              Coord base = y0 + A - std::lround(A*std::cos(2*3.141592f*f*x/N)),
                    end  = y0 + A - std::lround(A*std::cos(2*3.141592f*f*(x+1)/N));
              return (base != end) ? std::make_pair(base, end) : std::make_pair(base, base+1);
          })
          .line(term.foreground_color, { rect.p1.x, y0 + A }, { rect.p2.x, y0 + A }, TerminalOp::ClipSrc);

    std::cout << margin(1, 2, 0, 2, frame(BorderStyle::None, &canvas, term))
              << margin(1, 2, 0, 2, frame(u8"Label", &canvas, term))
              << margin(1, 2, 0, 2, frame(u8"Label", Align::Center, { BorderStyle::Solid, true }, &canvas, term))
              << margin(1, 2, 0, 2, frame(u8"Label", Align::Right, BorderStyle::SolidBold, &canvas, term))
              << margin(1, 2, 0, 2, frame(BorderStyle::Dashed, &canvas, term))
              << margin(1, 2, 0, 2, frame({ BorderStyle::Dashed, true }, &canvas, term))
              << margin(1, 2, 0, 2, frame(BorderStyle::DashedBold, &canvas, term))
              << margin(1, 2, 0, 2, frame(BorderStyle::Dotted, &canvas, term))
              << margin(1, 2, 0, 2, frame({ BorderStyle::Dotted, true }, &canvas, term))
              << margin(1, 2, 0, 2, frame(BorderStyle::DottedBold, &canvas, term))
              << margin(frame(BorderStyle::Double, &canvas, term)) << std::flush;

    return 0;
}